

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::initialiseSimplexLpRandomVectors(HEkk *this)

{
  HighsRandom *this_00;
  vector<int,_std::allocator<int>_> *pvVar1;
  int N;
  pointer piVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  vector<double,_std::allocator<double>_> *this_01;
  size_type __new_size;
  int N_00;
  ulong __new_size_00;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  N = (this->lp_).num_col_;
  __new_size = (size_type)N;
  __new_size_00 = (long)(this->lp_).num_row_ + __new_size;
  N_00 = (int)__new_size_00;
  if (N_00 != 0) {
    this_00 = &this->random_;
    if (N != 0) {
      pvVar1 = &(this->info_).numColPermutation_;
      std::vector<int,_std::allocator<int>_>::resize(pvVar1,__new_size);
      auVar3 = _DAT_003c57d0;
      if (0 < N) {
        piVar2 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = __new_size - 1;
        auVar6._8_4_ = (int)lVar8;
        auVar6._0_8_ = lVar8;
        auVar6._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar4 = 0;
        auVar6 = auVar6 ^ _DAT_003c57d0;
        auVar10 = _DAT_003c57c0;
        do {
          auVar9 = auVar10 ^ auVar3;
          if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                      auVar6._4_4_ < auVar9._4_4_) & 1)) {
            piVar2[uVar4] = (int)uVar4;
          }
          if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
              auVar9._12_4_ <= auVar6._12_4_) {
            piVar2[uVar4 + 1] = (int)uVar4 + 1;
          }
          uVar4 = uVar4 + 2;
          lVar8 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar8 + 2;
        } while ((N + 1U & 0xfffffffe) != uVar4);
      }
      HighsRandom::shuffle<int>
                (this_00,(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start,N);
    }
    pvVar1 = &(this->info_).numTotPermutation_;
    std::vector<int,_std::allocator<int>_>::resize(pvVar1,__new_size_00);
    auVar3 = _DAT_003c57d0;
    if (0 < N_00) {
      piVar2 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = (__new_size_00 & 0xffffffff) - 1;
      auVar7._8_4_ = (int)lVar8;
      auVar7._0_8_ = lVar8;
      auVar7._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar4 = 0;
      auVar7 = auVar7 ^ _DAT_003c57d0;
      auVar9 = _DAT_003c57c0;
      do {
        auVar10 = auVar9 ^ auVar3;
        if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                    auVar7._4_4_ < auVar10._4_4_) & 1)) {
          piVar2[uVar4] = (int)uVar4;
        }
        if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
            auVar10._12_4_ <= auVar7._12_4_) {
          piVar2[uVar4 + 1] = (int)uVar4 + 1;
        }
        uVar4 = uVar4 + 2;
        lVar8 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar8 + 2;
      } while ((N_00 + 1U & 0xfffffffe) != uVar4);
    }
    HighsRandom::shuffle<int>
              (this_00,(this->info_).numTotPermutation_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start,N_00);
    this_01 = &(this->info_).numTotRandomValue_;
    std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size_00);
    if (0 < N_00) {
      uVar4 = 0;
      do {
        dVar5 = HighsRandom::fraction(this_00);
        (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar4] = dVar5;
        uVar4 = uVar4 + 1;
      } while ((__new_size_00 & 0xffffffff) != uVar4);
    }
  }
  return;
}

Assistant:

void HEkk::initialiseSimplexLpRandomVectors() {
  const HighsInt num_col = lp_.num_col_;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  if (!num_tot) return;
  // Instantiate and (re-)initialise the random number generator
  //  HighsRandom random;
  HighsRandom& random = random_;
  //  random.initialise();

  if (num_col) {
    // Generate a random permutation of the column indices
    vector<HighsInt>& numColPermutation = info_.numColPermutation_;
    numColPermutation.resize(num_col);
    for (HighsInt i = 0; i < num_col; i++) numColPermutation[i] = i;
    random.shuffle(numColPermutation.data(), num_col);
  }

  // Re-initialise the random number generator and generate the
  // random vectors in the same order as hsol to maintain repeatable
  // performance
  // random.initialise();

  // Generate a random permutation of all the indices
  vector<HighsInt>& numTotPermutation = info_.numTotPermutation_;
  numTotPermutation.resize(num_tot);
  for (HighsInt i = 0; i < num_tot; i++) numTotPermutation[i] = i;
  random.shuffle(numTotPermutation.data(), num_tot);

  // Generate a vector of random reals
  info_.numTotRandomValue_.resize(num_tot);
  vector<double>& numTotRandomValue = info_.numTotRandomValue_;
  for (HighsInt i = 0; i < num_tot; i++) {
    numTotRandomValue[i] = random.fraction();
  }
}